

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O0

Item * __thiscall Item::getName_abi_cxx11_(Item *this)

{
  string *in_RSI;
  Item *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

Item::Item(std::string d, itemType t) : name(d), item(t) {}